

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

void __thiscall Reader::processsossec(Reader *this)

{
  map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
  *this_00;
  anon_union_8_5_ebd6940d_for_ProcessedToken_1 aVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  SOS *this_01;
  ProcessedToken *pPVar5;
  vector<std::pair<std::shared_ptr<Variable>,_double>,_std::allocator<std::pair<std::shared_ptr<Variable>,_double>_>_>
  *this_02;
  LpSectionKeyword this_section_keyword;
  shared_ptr<SOS> sos;
  pair<std::shared_ptr<Variable>,_double> local_78;
  shared_ptr<Variable> var;
  string name;
  
  this_section_keyword = SOS;
  this_00 = &this->sectiontokens;
  sVar2 = std::
          map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
          ::count(this_00,&this_section_keyword);
  if (sVar2 != 0) {
    pmVar3 = std::
             map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
             ::operator[](this_00,&this_section_keyword);
    pmVar4 = std::
             map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
             ::operator[](this_00,&this_section_keyword);
    while ((pmVar3->first)._M_current != (pmVar4->second)._M_current) {
      this_01 = (SOS *)operator_new(0x40);
      SOS::SOS(this_01);
      std::__shared_ptr<SOS,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<SOS,void>
                ((__shared_ptr<SOS,(__gnu_cxx::_Lock_policy)2> *)&sos,this_01);
      lpassert(((pmVar3->first)._M_current)->type == CONID);
      std::__cxx11::string::assign
                ((char *)sos.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      pPVar5 = (pmVar3->first)._M_current + 1;
      (pmVar3->first)._M_current = pPVar5;
      lpassert(pPVar5 != (pmVar4->second)._M_current);
      lpassert(((pmVar3->first)._M_current)->type == SOSTYPE);
      pPVar5 = (pmVar3->first)._M_current;
      (sos.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type =
           2 - (ushort)((pPVar5->field_1).keyword == NONE);
      pPVar5 = pPVar5 + 1;
      (pmVar3->first)._M_current = pPVar5;
      while( true ) {
        if ((pPVar5 == (pmVar4->second)._M_current) || (pPVar5->type != CONID)) goto LAB_00210f8c;
        std::__cxx11::string::string((string *)&name,(pPVar5->field_1).name,(allocator *)&local_78);
        pPVar5 = (pmVar3->first)._M_current;
        if ((pPVar5 + 1 == (pmVar4->second)._M_current) || (pPVar5[1].type != CONST)) break;
        Builder::getvarbyname((Builder *)&var,(string *)&this->builder);
        aVar1 = pPVar5[1].field_1;
        this_02 = &(sos.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->entries;
        std::__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)&local_78,
                   (__shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2> *)&var);
        local_78.second = aVar1.value;
        std::
        vector<std::pair<std::shared_ptr<Variable>,double>,std::allocator<std::pair<std::shared_ptr<Variable>,double>>>
        ::emplace_back<std::pair<std::shared_ptr<Variable>,double>>
                  ((vector<std::pair<std::shared_ptr<Variable>,double>,std::allocator<std::pair<std::shared_ptr<Variable>,double>>>
                    *)this_02,&local_78);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_78.first.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        (pmVar3->first)._M_current = pPVar5 + 2;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&var.super___shared_ptr<Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string((string *)&name);
        pPVar5 = (pmVar3->first)._M_current;
      }
      std::__cxx11::string::~string((string *)&name);
LAB_00210f8c:
      std::vector<std::shared_ptr<SOS>,_std::allocator<std::shared_ptr<SOS>_>_>::push_back
                (&(this->builder).model.soss,&sos);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sos.super___shared_ptr<SOS,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
  }
  return;
}

Assistant:

void Reader::processsossec() {
  const LpSectionKeyword this_section_keyword = LpSectionKeyword::SOS;
  if (!sectiontokens.count(this_section_keyword)) return;
  std::vector<ProcessedToken>::iterator& begin(
      sectiontokens[this_section_keyword].first);
  std::vector<ProcessedToken>::iterator& end(
      sectiontokens[this_section_keyword].second);
  while (begin != end) {
    std::shared_ptr<SOS> sos = std::shared_ptr<SOS>(new SOS);

    // sos1: S1 :: x1 : 1  x2 : 2  x3 : 3

    // name of SOS is mandatory
    lpassert(begin->type == ProcessedTokenType::CONID);
    sos->name = begin->name;
    ++begin;

    // SOS type
    lpassert(begin != end);
    lpassert(begin->type == ProcessedTokenType::SOSTYPE);
    sos->type = begin->sostype == SosType::SOS1 ? 1 : 2;
    ++begin;

    while (begin != end) {
      // process all "var : weight" entries
      // when processtokens() sees a string followed by a colon, it classifies
      // this as a CONID but in a SOS section, this is actually a variable
      // identifier
      if (begin->type != ProcessedTokenType::CONID) break;
      std::string name = begin->name;
      std::vector<ProcessedToken>::iterator next = begin;
      ++next;
      if (next != end && next->type == ProcessedTokenType::CONST) {
        auto var = builder.getvarbyname(name);
        double weight = next->value;

        sos->entries.push_back({var, weight});

        begin = ++next;
        continue;
      }

      break;
    }

    builder.model.soss.push_back(sos);
  }
}